

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

bool test_encode_int_custom_size(char *buf,int64_t val,int size)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  
  bVar1 = (byte)val;
  switch(size) {
  case 1:
    if (val - 0x80U < 0xffffffffffffff60) {
      return false;
    }
    if (val < 0) {
      val = (int64_t)(bVar1 | 0xe0);
    }
    *buf = (char)val;
    break;
  case 2:
    if ((char)bVar1 != val) {
      return false;
    }
    *buf = -0x30;
    buf[1] = bVar1;
    break;
  case 3:
    uVar2 = (ushort)val;
    if ((short)uVar2 != val) {
      return false;
    }
    *buf = -0x2f;
    *(ushort *)(buf + 1) = uVar2 << 8 | uVar2 >> 8;
    break;
  default:
    abort();
  case 5:
    uVar3 = (uint)val;
    if ((int)uVar3 != val) {
      return false;
    }
    *buf = -0x2e;
    *(uint *)(buf + 1) =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    break;
  case 9:
    *buf = -0x2d;
    *(ulong *)(buf + 1) =
         (ulong)val >> 0x38 | (val & 0xff000000000000U) >> 0x28 | (val & 0xff0000000000U) >> 0x18 |
         (val & 0xff00000000U) >> 8 | (val & 0xff000000U) << 8 | (val & 0xff0000U) << 0x18 |
         (val & 0xff00U) << 0x28 | val << 0x38;
  }
  return true;
}

Assistant:

MP_IMPL int
mp_read_double_impl(const char **data, double *ret, bool may_lose_precision)
{
	int64_t ival;
	uint64_t uval;
	double val;
	const char *p = *data;
	uint8_t c = mp_load_u8(&p);
	switch (c) {
	case 0xd0:
		*ret = (int8_t) mp_load_u8(&p);
		break;
	case 0xd1:
		*ret = (int16_t) mp_load_u16(&p);
		break;
	case 0xd2:
		*ret = (int32_t) mp_load_u32(&p);
		break;
	case 0xd3:
		ival = (int64_t) mp_load_u64(&p);
		val = (double) ival;
		if (!may_lose_precision && (int64_t)val != ival)
			return -1;
		*ret = val;
		break;
	case 0xcc:
		*ret = mp_load_u8(&p);
		break;
	case 0xcd:
		*ret = mp_load_u16(&p);
		break;
	case 0xce:
		*ret = mp_load_u32(&p);
		break;
	case 0xcf:
		uval = mp_load_u64(&p);
		val = (double)uval;
		if (!may_lose_precision && (uint64_t)val != uval)
			return -1;
		*ret = val;
		break;
	case 0xca:
		*ret = mp_load_float(&p);
		break;
	case 0xcb:
		*ret = mp_load_double(&p);
		break;
	default:
		if (mp_unlikely(c < 0xe0 && c > 0x7f))
			return -1;
		*ret = (int8_t) c;
		break;
	}
	*data = p;
	return 0;
}